

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void ObsGetLegalMove(pyhanabi_observation_t *observation,int index,pyhanabi_move_t *move)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x324,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
  }
  pvVar1 = observation->observation;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("observation->observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x325,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
  }
  if (move == (pyhanabi_move_t *)0x0) {
    __assert_fail("move != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x326,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
  }
  puVar2 = (undefined8 *)operator_new(8);
  if ((ulong)(long)index <
      (ulong)(*(long *)((long)pvVar1 + 0x80) - *(long *)((long)pvVar1 + 0x78) >> 3)) {
    *puVar2 = *(undefined8 *)(*(long *)((long)pvVar1 + 0x78) + (long)index * 8);
    move->move = puVar2;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void ObsGetLegalMove(pyhanabi_observation_t* observation, int index,
                     pyhanabi_move_t* move) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      (reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
           observation->observation)
           ->LegalMoves()
           .at(index)));
}